

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isCubeGatherResultValid<tcu::LookupPrecision,float>
               (TextureCubeView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               int componentNdx,Vector<float,_4> *result)

{
  float face_;
  bool bVar1;
  Vector<float,_2> local_80;
  undefined1 local_78 [8];
  CubeFaceFloatCoords faceCoords;
  int tryFaceNdx;
  CubeFace possibleFaces [6];
  int local_44;
  Vector<float,_4> *pVStack_40;
  int numPossibleFaces;
  Vector<float,_4> *result_local;
  Vec3 *pVStack_30;
  int componentNdx_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  TextureCubeView *texture_local;
  
  local_44 = 0;
  pVStack_40 = result;
  result_local._4_4_ = componentNdx;
  pVStack_30 = coord;
  coord_local = (Vec3 *)prec;
  prec_local = (LookupPrecision *)sampler;
  sampler_local = (Sampler *)texture;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,(CubeFace *)&faceCoords.t,&local_44);
  if (local_44 == 0) {
    texture_local._7_1_ = true;
  }
  else {
    for (faceCoords.s = 0.0; (int)faceCoords.s < local_44;
        faceCoords.s = (float)((int)faceCoords.s + 1)) {
      face_ = (&faceCoords.t)[(int)faceCoords.s];
      projectToFace((tcu *)&local_80,(CubeFace)(&faceCoords.t)[(int)faceCoords.s],pVStack_30);
      CubeFaceCoords<float>::CubeFaceCoords
                ((CubeFaceCoords<float> *)local_78,(CubeFace)face_,&local_80);
      bVar1 = isGatherResultValid<tcu::LookupPrecision,float>
                        ((TextureCubeView *)sampler_local,(Sampler *)prec_local,
                         (LookupPrecision *)coord_local,(CubeFaceFloatCoords *)local_78,
                         result_local._4_4_,pVStack_40);
      if (bVar1) {
        return true;
      }
    }
    texture_local._7_1_ = false;
  }
  return texture_local._7_1_;
}

Assistant:

static bool isCubeGatherResultValid (const TextureCubeView&			texture,
									 const Sampler&					sampler,
									 const PrecType&				prec,
									 const Vec3&					coord,
									 int							componentNdx,
									 const Vector<ScalarType, 4>&	result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords faceCoords(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));

		if (isGatherResultValid(texture, sampler, prec, faceCoords, componentNdx, result))
			return true;
	}

	return false;
}